

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O2

void __thiscall
RasterizerA3<4u>::_renderImpl<CompositorScalar,true>(RasterizerA3<4u> *this,uint32_t argb32)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint32_t bPix;
  uint32_t uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong local_80;
  long local_40;
  
  lVar3 = *(long *)(*(long *)(this + 8) + 8);
  uVar13 = (ulong)*(int *)(this + 0x40);
  iVar2 = *(int *)(this + 0x44);
  puVar15 = (ulong *)(*(long *)(this + 0x48) * uVar13 * 8 + *(long *)(this + 0x50));
  lVar12 = *(long *)(this + 0x58) * uVar13 * 8 + *(long *)(this + 0x60);
  lVar10 = lVar3 * uVar13 + *(long *)(*(long *)(this + 8) + 0x10);
  bPix = PixelUtils::premultiply(argb32);
  for (; uVar13 <= (ulong)(long)iVar2; uVar13 = uVar13 + 1) {
    local_40 = *(long *)(this + 0x48);
    uVar11 = 0;
    uVar14 = 0;
    uVar9 = 0;
    do {
      local_80 = *puVar15;
      *puVar15 = 0;
      uVar1 = uVar9 + 0x100;
      while (local_80 != 0) {
        lVar4 = 0;
        if (local_80 != 0) {
          for (; (local_80 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar6 = -1L << ((byte)lVar4 & 0x3f);
        uVar16 = (uint)((int)lVar4 << 2) | uVar9;
        uVar17 = uVar14;
        if (uVar14 < uVar16) {
          uVar7 = -uVar11;
          if (0 < (int)uVar11) {
            uVar7 = uVar11;
          }
          if (0xfe < uVar7) {
            uVar7 = 0xff;
          }
          uVar17 = uVar16;
          if (uVar7 != 0) {
            if (uVar7 == 0xff) {
              for (; uVar14 < uVar16; uVar14 = uVar14 + 1) {
                *(uint32_t *)(lVar10 + uVar14 * 4) = bPix;
              }
            }
            else {
              for (; uVar14 < uVar16; uVar14 = uVar14 + 1) {
                uVar5 = PixelUtils::src(*(uint32_t *)(lVar10 + uVar14 * 4),bPix,uVar7);
                *(uint32_t *)(lVar10 + uVar14 * 4) = uVar5;
              }
            }
          }
        }
        if (local_80 == uVar6) {
          uVar14 = (long)*(int *)(this + 0x30);
          if (uVar1 < (ulong)(long)*(int *)(this + 0x30)) {
            uVar14 = uVar1;
          }
          local_80 = 0;
        }
        else {
          uVar6 = uVar6 ^ local_80;
          lVar4 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          local_80 = -1L << ((byte)lVar4 & 0x3f) ^ uVar6;
          uVar14 = (uint)((int)lVar4 << 2) | uVar9;
        }
        for (; uVar17 < uVar14; uVar17 = uVar17 + 1) {
          uVar11 = uVar11 + *(int *)(lVar12 + uVar17 * 8);
          uVar8 = uVar11 - (*(int *)(lVar12 + 4 + uVar17 * 8) >> 9);
          uVar7 = -uVar8;
          if (0 < (int)uVar8) {
            uVar7 = uVar8;
          }
          *(undefined8 *)(lVar12 + uVar17 * 8) = 0;
          uVar5 = bPix;
          if (uVar7 < 0xff) {
            uVar5 = PixelUtils::src(*(uint32_t *)(lVar10 + uVar17 * 4),bPix,uVar7);
          }
          *(uint32_t *)(lVar10 + uVar17 * 4) = uVar5;
        }
      }
      puVar15 = puVar15 + 1;
      local_40 = local_40 + -1;
      uVar9 = uVar1;
    } while (local_40 != 0);
    uVar9 = (ulong)*(int *)(this + 0x30);
    if (uVar14 < uVar9) {
      uVar7 = -uVar11;
      if (0 < (int)uVar11) {
        uVar7 = uVar11;
      }
      if (0xfe < uVar7) {
        uVar7 = 0xff;
      }
      if (uVar7 != 0) {
        if (uVar7 == 0xff) {
          for (; uVar14 < uVar9; uVar14 = uVar14 + 1) {
            *(uint32_t *)(lVar10 + uVar14 * 4) = bPix;
          }
        }
        else {
          for (; uVar14 < uVar9; uVar14 = uVar14 + 1) {
            uVar5 = PixelUtils::src(*(uint32_t *)(lVar10 + uVar14 * 4),bPix,uVar7);
            *(uint32_t *)(lVar10 + uVar14 * 4) = uVar5;
          }
        }
      }
    }
    lVar10 = lVar10 + lVar3;
    lVar12 = lVar12 + *(long *)(this + 0x58) * 8;
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}